

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O2

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/string_object.cpp:297:69)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_string_object_cpp:297:69)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  gc_heap *h;
  pointer pvVar1;
  double dVar2;
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  wstring_view wVar6;
  gc_heap_ptr_untyped gStack_78;
  double local_68;
  double dStack_60;
  string str;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_38;
  wstring_view local_28;
  
  h = (this->f).global.super_gc_heap_ptr_untyped.heap_;
  to_string((mjs *)&str,h,this_);
  pvVar1 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
      super__Vector_impl_data._M_finish == pvVar1) {
    pvVar1 = (pointer)&value::undefined;
  }
  dVar2 = to_integer(pvVar1);
  pvVar1 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_68 = INFINITY;
  if ((1 < (ulong)(((long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x28)) &&
     (pvVar1[1].type_ != undefined)) {
    local_68 = to_integer(pvVar1 + 1);
  }
  wVar6 = string::view(&str);
  auVar3._8_4_ = wVar6._M_len._4_4_;
  auVar3._0_8_ = wVar6._M_len;
  auVar3._12_4_ = 0x45300000;
  dStack_60 = auVar3._8_8_ - 1.9342813113834067e+25;
  dVar5 = dStack_60 + ((double)CONCAT44(0x43300000,(int)wVar6._M_len) - 4503599627370496.0);
  if (dVar2 < 0.0) {
    dVar4 = dVar2 + dVar5;
    dVar2 = 0.0;
    if (0.0 <= dVar4) {
      dVar2 = dVar4;
    }
  }
  dVar5 = dVar5 - dVar2;
  dVar4 = 0.0;
  if (0.0 <= local_68) {
    dVar4 = local_68;
  }
  local_68 = dVar5;
  if (dVar4 <= dVar5) {
    local_68 = dVar4;
  }
  if (local_68 <= 0.0) {
    local_38 = (basic_string_view<wchar_t,_std::char_traits<wchar_t>_>)(ZEXT816(0x17ee61) << 0x40);
    string::string((string *)&gStack_78,h,(string_view *)&local_38);
    value::value(__return_storage_ptr__,(string *)&gStack_78);
  }
  else {
    local_28 = string::view(&str);
    local_38 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::substr
                         (&local_28,
                          (long)dVar2 >> 0x3f & (long)(dVar2 - 9.223372036854776e+18) | (long)dVar2,
                          (long)local_68 >> 0x3f & (long)(local_68 - 9.223372036854776e+18) |
                          (long)local_68);
    string::string((string *)&gStack_78,h,&local_38);
    value::value(__return_storage_ptr__,(string *)&gStack_78);
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&gStack_78);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&str);
  return __return_storage_ptr__;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }